

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O2

int KINSetMaxSetupCalls(void *kinmem,long msbset)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    kinmem = (KINMem)0x0;
    error_code = -1;
    line = 0x161;
  }
  else {
    if (-1 < msbset) {
      if (msbset == 0) {
        *(undefined8 *)((long)kinmem + 0x40) = 10;
      }
      else {
        *(long *)((long)kinmem + 0x40) = msbset;
      }
      return 0;
    }
    msgfmt = "Illegal msbset < 0.";
    error_code = -2;
    line = 0x169;
  }
  KINProcessError((KINMem)kinmem,error_code,line,"KINSetMaxSetupCalls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int KINSetMaxSetupCalls(void* kinmem, long int msbset)
{
  KINMem kin_mem;

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }

  kin_mem = (KINMem)kinmem;

  if (msbset < 0)
  {
    KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MSBSET);
    return (KIN_ILL_INPUT);
  }

  if (msbset == 0) { kin_mem->kin_msbset = MSBSET_DEFAULT; }
  else { kin_mem->kin_msbset = msbset; }

  return (KIN_SUCCESS);
}